

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcVertexLoop::IfcVertexLoop(IfcVertexLoop *this)

{
  *(undefined ***)&this->field_0x48 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(char **)&this->field_0x58 = "IfcVertexLoop";
  IfcLoop::IfcLoop(&this->super_IfcLoop,&PTR_construction_vtable_24__007f82f0);
  *(undefined8 *)&(this->super_IfcLoop).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcLoop).field_0x40 = 0;
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7f8238;
  *(undefined8 *)&this->field_0x48 = 0x7f82d8;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7f8260;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7f8288;
  *(undefined8 *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 = 0x7f82b0
  ;
  return;
}

Assistant:

IfcVertexLoop() : Object("IfcVertexLoop") {}